

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

string * __thiscall
pbrt::SphericalMapping2D::ToString_abi_cxx11_
          (string *__return_storage_ptr__,SphericalMapping2D *this)

{
  Transform *in_RCX;
  
  StringPrintf<pbrt::Transform_const&>
            (__return_storage_ptr__,(pbrt *)"[ SphericalMapping2D textureFromRender: %s ]",
             (char *)this,in_RCX);
  return __return_storage_ptr__;
}

Assistant:

std::string SphericalMapping2D::ToString() const {
    return StringPrintf("[ SphericalMapping2D textureFromRender: %s ]",
                        textureFromRender);
}